

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

void __thiscall
rcg::Device::Device(Device *this,shared_ptr<rcg::Interface> *_parent,
                   shared_ptr<const_rcg::GenTLWrapper> *_gentl,char *_id)

{
  char *in_RCX;
  long in_RDI;
  shared_ptr<const_rcg::GenTLWrapper> *this_00;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffff68;
  
  std::enable_shared_from_this<rcg::Device>::enable_shared_from_this
            ((enable_shared_from_this<rcg::Device> *)0x11bfe6);
  std::shared_ptr<rcg::Interface>::shared_ptr((shared_ptr<rcg::Interface> *)0x11bff9);
  std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x11c00c);
  std::__cxx11::string::string((string *)(in_RDI + 0x30));
  std::mutex::mutex((mutex *)0x11c02d);
  this_00 = (shared_ptr<const_rcg::GenTLWrapper> *)(in_RDI + 0x98);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11c043);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x11c059);
  std::shared_ptr<rcg::CPort>::shared_ptr((shared_ptr<rcg::CPort> *)0x11c06f);
  std::shared_ptr<rcg::CPort>::shared_ptr((shared_ptr<rcg::CPort> *)0x11c085);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x11c09b);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x11c0b1);
  std::shared_ptr<GenApi_3_4::CEventAdapterGeneric>::shared_ptr
            ((shared_ptr<GenApi_3_4::CEventAdapterGeneric> *)0x11c0c7);
  std::vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_>::vector
            ((vector<std::weak_ptr<rcg::Stream>,_std::allocator<std::weak_ptr<rcg::Stream>_>_> *)
             0x11c0dd);
  std::shared_ptr<rcg::Interface>::operator=
            ((shared_ptr<rcg::Interface> *)this_00,
             (shared_ptr<rcg::Interface> *)in_stack_ffffffffffffff68);
  std::shared_ptr<const_rcg::GenTLWrapper>::operator=(this_00,in_stack_ffffffffffffff68);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x30),in_RCX);
  *(undefined4 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  *(undefined8 *)(in_RDI + 0x90) = 0;
  return;
}

Assistant:

Device::Device(const std::shared_ptr<Interface> &_parent,
               const std::shared_ptr<const GenTLWrapper> &_gentl, const char *_id)
{
  parent=_parent;
  gentl=_gentl;
  id=_id;

  n_open=0;
  dev=0;
  rp=0;
  event=0;
}